

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L.c
# Opt level: O1

int envy_bios_parse_bit_L(envy_bios *bios,envy_bios_bit_entry *bit)

{
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  envy_bios_L_unk0_entry *peVar7;
  uint16_t uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint idx;
  
  (bios->L).bit = bit;
  idx = 0;
  do {
    iVar5 = parse_at(bios,idx,(char **)0x0);
    idx = idx + 1;
  } while (iVar5 == 0);
  uVar4 = (bios->L).unk0.offset;
  if (uVar4 != 0) {
    if ((uint)uVar4 < bios->length) {
      (bios->L).unk0.version = bios->data[(uint)uVar4];
    }
    else {
      (bios->L).unk0.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    uVar1 = (bios->L).unk0.version;
    if ((uVar1 == '@') || (uVar1 == '0')) {
      lVar9 = (ulong)(bios->L).unk0.offset + 1;
      if ((uint)lVar9 < bios->length) {
        (bios->L).unk0.hlen = bios->data[lVar9];
        iVar5 = 0;
      }
      else {
        (bios->L).unk0.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar5 = -0xe;
      }
      lVar9 = (ulong)(bios->L).unk0.offset + 2;
      if ((uint)lVar9 < bios->length) {
        (bios->L).unk0.rlen = bios->data[lVar9];
        iVar11 = 0;
      }
      else {
        (bios->L).unk0.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar11 = -0xe;
      }
      lVar9 = (ulong)(bios->L).unk0.offset + 3;
      if ((uint)lVar9 < bios->length) {
        (bios->L).unk0.entriesnum = bios->data[lVar9];
        iVar6 = 0;
      }
      else {
        (bios->L).unk0.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar6 = -0xe;
      }
      (bios->L).unk0.valid = (iVar11 == 0 && iVar5 == 0) && iVar6 == 0;
      bVar2 = (bios->L).unk0.entriesnum;
      peVar7 = (envy_bios_L_unk0_entry *)malloc((ulong)((uint)bVar2 + (uint)bVar2));
      (bios->L).unk0.entries = peVar7;
      if (bVar2 != 0) {
        bVar3 = (bios->L).unk0.rlen;
        uVar8 = (ushort)(bios->L).unk0.hlen + (bios->L).unk0.offset;
        uVar10 = 0;
        do {
          peVar7[uVar10].offset = uVar8;
          uVar8 = uVar8 + bVar3;
          uVar10 = uVar10 + 1;
        } while (bVar2 != uVar10);
      }
    }
    else {
      fprintf(_stderr,"Unknown L UNK0 table version 0x%x\n");
    }
  }
  return 0;
}

Assistant:

int
envy_bios_parse_bit_L(struct envy_bios *bios, struct envy_bios_bit_entry *bit)
{
	struct envy_bios_L *l = &bios->L;
	unsigned int idx = 0;

	l->bit = bit;

	while (!parse_at(bios, idx, NULL))
		idx++;

	/* parse tables */
	envy_bios_parse_L_unk0(bios);

	return 0;
}